

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_CCtxParams_init_internal
               (ZSTD_CCtx_params *cctxParams,ZSTD_parameters *params,int compressionLevel)

{
  uint uVar1;
  int iVar2;
  ZSTD_useRowMatchFinderMode_e ZVar3;
  int compressionLevel_local;
  ZSTD_parameters *params_local;
  ZSTD_CCtx_params *cctxParams_local;
  
  memset(cctxParams,0,0xb0);
  uVar1 = (params->cParams).chainLog;
  (cctxParams->cParams).windowLog = (params->cParams).windowLog;
  (cctxParams->cParams).chainLog = uVar1;
  uVar1 = (params->cParams).searchLog;
  (cctxParams->cParams).hashLog = (params->cParams).hashLog;
  (cctxParams->cParams).searchLog = uVar1;
  uVar1 = (params->cParams).targetLength;
  (cctxParams->cParams).minMatch = (params->cParams).minMatch;
  (cctxParams->cParams).targetLength = uVar1;
  (cctxParams->cParams).strategy = (params->cParams).strategy;
  iVar2 = (params->fParams).checksumFlag;
  (cctxParams->fParams).contentSizeFlag = (params->fParams).contentSizeFlag;
  (cctxParams->fParams).checksumFlag = iVar2;
  (cctxParams->fParams).noDictIDFlag = (params->fParams).noDictIDFlag;
  cctxParams->compressionLevel = compressionLevel;
  ZVar3 = ZSTD_resolveRowMatchFinderMode(cctxParams->useRowMatchFinder,&params->cParams);
  cctxParams->useRowMatchFinder = ZVar3;
  return;
}

Assistant:

static void ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params* cctxParams, ZSTD_parameters const* params, int compressionLevel)
{
    assert(!ZSTD_checkCParams(params->cParams));
    ZSTD_memset(cctxParams, 0, sizeof(*cctxParams));
    cctxParams->cParams = params->cParams;
    cctxParams->fParams = params->fParams;
    /* Should not matter, as all cParams are presumed properly defined.
     * But, set it for tracing anyway.
     */
    cctxParams->compressionLevel = compressionLevel;
    cctxParams->useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams->useRowMatchFinder, &params->cParams);
    DEBUGLOG(4, "ZSTD_CCtxParams_init_internal: useRowMatchFinder=%d", cctxParams->useRowMatchFinder);
}